

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

void plutovg_font_face_get_glyph_metrics
               (plutovg_font_face_t *face,float size,plutovg_codepoint_t codepoint,
               float *advance_width,float *left_side_bearing,plutovg_rect_t *extents)

{
  glyph_t *pgVar1;
  float fVar2;
  glyph_t *glyph;
  float scale;
  plutovg_rect_t *extents_local;
  float *left_side_bearing_local;
  float *advance_width_local;
  plutovg_codepoint_t codepoint_local;
  float size_local;
  plutovg_font_face_t *face_local;
  
  fVar2 = plutovg_font_face_get_scale(face,size);
  pgVar1 = plutovg_font_face_get_glyph(face,codepoint);
  if (advance_width != (float *)0x0) {
    *advance_width = (float)pgVar1->advance_width * fVar2;
  }
  if (left_side_bearing != (float *)0x0) {
    *left_side_bearing = (float)pgVar1->left_side_bearing * fVar2;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = (float)pgVar1->x1 * fVar2;
    extents->y = (float)pgVar1->y2 * -fVar2;
    extents->w = (float)(pgVar1->x2 - pgVar1->x1) * fVar2;
    extents->h = (float)(pgVar1->y1 - pgVar1->y2) * -fVar2;
  }
  return;
}

Assistant:

void plutovg_font_face_get_glyph_metrics(plutovg_font_face_t* face, float size, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    float scale = plutovg_font_face_get_scale(face, size);
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    if(advance_width) *advance_width = glyph->advance_width * scale;
    if(left_side_bearing) *left_side_bearing = glyph->left_side_bearing * scale;
    if(extents) {
        extents->x = glyph->x1 * scale;
        extents->y = glyph->y2 * -scale;
        extents->w = (glyph->x2 - glyph->x1) * scale;
        extents->h = (glyph->y1 - glyph->y2) * -scale;
    }
}